

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_manager.h
# Opt level: O0

bool __thiscall
miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::
waitingCompare(TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>
               *this,int32_t lhs,int32_t rhs)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  shared_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo>
  *in_RDI;
  TimerInfoPtr infor;
  TimerInfoPtr infol;
  shared_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo>
  *in_stack_ffffffffffffffb0;
  int32_t in_stack_ffffffffffffffc4;
  TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>
  *in_stack_ffffffffffffffc8;
  __shared_ptr local_28 [39];
  bool local_1;
  
  findTimer(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  findTimer(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_28);
  if ((bVar1) &&
     (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffc8),
     bVar1)) {
    peVar2 = std::
             __shared_ptr_access<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4ca883);
    peVar3 = std::
             __shared_ptr_access<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4ca895);
    local_1 = TimeBase<miniros::SteadyTime,_miniros::WallDuration>::operator<
                        (&(peVar2->next_expected).
                          super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>,
                         &peVar3->next_expected);
  }
  else {
    local_1 = std::operator<(in_stack_ffffffffffffffb0,in_RDI);
  }
  std::
  shared_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo>
  ::~shared_ptr((shared_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo>
                 *)0x4ca8ed);
  std::
  shared_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo>
  ::~shared_ptr((shared_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo>
                 *)0x4ca8f7);
  return (bool)(local_1 & 1);
}

Assistant:

bool TimerManager<T, D, E>::waitingCompare(int32_t lhs, int32_t rhs)
{
  TimerInfoPtr infol = findTimer(lhs);
  TimerInfoPtr infor = findTimer(rhs);
  if (!infol || !infor)
  {
    return infol < infor;
  }

  return infol->next_expected < infor->next_expected;
}